

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::BuildEnumValue
          (DescriptorBuilder *this,EnumValueDescriptorProto *proto,EnumDescriptor *parent,
          EnumValueDescriptor *result,FlatAllocator *alloc)

{
  char *pcVar1;
  void *pvVar2;
  long lVar3;
  string *psVar4;
  pointer pcVar5;
  size_type sVar6;
  Descriptor *pDVar7;
  pointer pcVar8;
  size_type sVar9;
  FileDescriptorTables *this_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  undefined8 uVar10;
  undefined8 proto_00;
  bool bVar11;
  bool bVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  undefined8 *puVar13;
  long *plVar14;
  SymbolBase *ptr;
  string_view name;
  string_view name_00;
  string_view full_name_00;
  string_view element_name;
  string_view option_name;
  string_view name_01;
  string_view full_name_01;
  string full_name;
  string outer_scope;
  EnumValueOptions *local_158;
  FieldOptions_FeatureSupport *local_150;
  undefined1 local_148 [40];
  EnumValueDescriptor *local_120 [5];
  string local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [32];
  code *pcStack_b8;
  undefined1 local_b0 [17];
  undefined7 uStack_9f;
  intptr_t iStack_98;
  string local_80;
  AlphaNum local_60;
  
  local_158 = (EnumValueOptions *)local_148;
  local_150 = (FieldOptions_FeatureSupport *)0x0;
  local_148[0] = 0;
  local_148._16_8_ = parent;
  local_120[4] = (EnumValueDescriptor *)alloc;
  local_d8._0_8_ = result;
  local_d8._16_8_ = parent;
  std::__cxx11::string::reserve((ulong)&local_158);
  pcVar1 = ((DescriptorNames *)&((ThreadSafeArena *)local_148._16_8_)->alloc_policy_)->payload_;
  std::__cxx11::string::append((char *)&local_158,(ulong)(pcVar1 + ~(ulong)*(ushort *)(pcVar1 + 2)))
  ;
  std::__cxx11::string::_M_append
            ((char *)&local_158,
             *(ulong *)((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc))
  ;
  pvVar2 = (proto->field_0)._impl_.name_.tagged_ptr_.ptr_;
  this_01 = protobuf::(anonymous_namespace)::
            FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
            ::AllocateArray<std::__cxx11::string>
                      ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                        *)local_120[4],2);
  plVar14 = (long *)((ulong)pvVar2 & 0xfffffffffffffffc);
  local_148._24_8_ = local_120;
  lVar3 = *plVar14;
  std::__cxx11::string::_M_construct<char*>((string *)(local_148 + 0x18),lVar3,plVar14[1] + lVar3);
  local_d8._8_8_ = proto;
  std::__cxx11::string::operator=((string *)this_01,(string *)(local_148 + 0x18));
  if (local_158 == (EnumValueOptions *)local_148) {
    iStack_98 = local_148._8_8_;
    local_b0._0_8_ = (EnumValueOptions *)(local_b0 + 0x10);
  }
  else {
    local_b0._0_8_ = local_158;
  }
  stack0xffffffffffffff60 = CONCAT71(local_148._1_7_,local_148[0]);
  local_b0._8_8_ = local_150;
  local_150 = (FieldOptions_FeatureSupport *)0x0;
  local_148[0] = 0;
  local_158 = (EnumValueOptions *)local_148;
  std::__cxx11::string::operator=((string *)(this_01 + 1),(string *)local_b0);
  if ((EnumValueOptions *)local_b0._0_8_ != (EnumValueOptions *)(local_b0 + 0x10)) {
    operator_delete((void *)local_b0._0_8_,stack0xffffffffffffff60 + 1);
  }
  proto_00 = local_d8._8_8_;
  uVar10 = local_148._16_8_;
  if ((EnumValueDescriptor **)local_148._24_8_ != local_120) {
    operator_delete((void *)local_148._24_8_,(ulong)((long)local_120[0] + 1));
  }
  result->all_names_ = this_01;
  result->number_ = *(int *)(proto_00 + 0x28);
  result->type_ = (EnumDescriptor *)uVar10;
  puVar13 = (undefined8 *)(*(ulong *)(proto_00 + 0x18) & 0xfffffffffffffffc);
  name_00._M_str = (char *)*puVar13;
  name_00._M_len = puVar13[1];
  full_name_01._M_str = this_01[1]._M_dataplus._M_p;
  full_name_01._M_len = this_01[1]._M_string_length;
  ValidateSymbolName(this,name_00,full_name_01,(Message *)proto_00);
  option_name._M_str = "google.protobuf.EnumValueOptions";
  option_name._M_len = 0x20;
  AllocateOptions<google::protobuf::EnumValueDescriptor>
            (this,(Proto *)proto_00,result,3,option_name,(FlatAllocator *)local_120[4]);
  uVar10 = local_148._16_8_;
  psVar4 = result->all_names_;
  pcVar5 = psVar4[1]._M_dataplus._M_p;
  sVar6 = psVar4[1]._M_string_length;
  pDVar7 = (Descriptor *)
           (((ThreadSafeArena *)local_148._16_8_)->mutex_).mu_.super___atomic_base<long>._M_i;
  pcVar8 = (psVar4->_M_dataplus)._M_p;
  sVar9 = psVar4->_M_string_length;
  (result->super_SymbolBaseN<0>).super_SymbolBase.symbol_type_ = '\x05';
  full_name_00._M_str = pcVar5;
  full_name_00._M_len = sVar6;
  name_01._M_str = pcVar8;
  name_01._M_len = sVar9;
  bVar11 = AddSymbol(this,full_name_00,pDVar7,name_01,(Message *)proto_00,(Symbol)result);
  this_00 = this->file_tables_;
  pcVar5 = (result->all_names_->_M_dataplus)._M_p;
  sVar6 = result->all_names_->_M_string_length;
  (result->super_SymbolBaseN<1>).super_SymbolBase.symbol_type_ = '\x06';
  name._M_str = pcVar5;
  name._M_len = sVar6;
  bVar12 = FileDescriptorTables::AddAliasUnderParent
                     (this_00,(void *)uVar10,name,(Symbol)&result->super_SymbolBaseN<1>);
  if (!bVar11 && bVar12) {
    local_f8._8_8_ = (EnumValueOptions *)0x0;
    local_e8[0] = 0;
    pDVar7 = (Descriptor *)(((ThreadSafeArena *)uVar10)->mutex_).mu_.super___atomic_base<long>._M_i;
    local_f8._0_8_ = (FieldOptions_FeatureSupport *)local_e8;
    if (pDVar7 == (Descriptor *)0x0) {
      psVar4 = this->file_->package_;
      pcVar5 = (psVar4->_M_dataplus)._M_p;
      local_148._24_8_ = local_120;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_148 + 0x18),pcVar5,pcVar5 + psVar4->_M_string_length);
    }
    else {
      pcVar1 = (pDVar7->all_names_).payload_;
      local_148._24_8_ = local_120;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_148 + 0x18),pcVar1 + ~(ulong)*(ushort *)(pcVar1 + 2),pcVar1 + -1);
    }
    std::__cxx11::string::operator=(local_f8,(string *)(local_148 + 0x18));
    if ((EnumValueDescriptor **)local_148._24_8_ != local_120) {
      operator_delete((void *)local_148._24_8_,(ulong)((long)local_120[0] + 1));
    }
    if ((EnumValueOptions *)local_f8._8_8_ == (EnumValueOptions *)0x0) {
      std::__cxx11::string::_M_replace((ulong)local_f8,0,(char *)0x0,0x3e1ab3);
    }
    else {
      local_148._24_8_ = 1;
      local_148._32_8_ =
           (long)
           "Note that enum values use C++ scoping rules, meaning that enum values are siblings of their type, not children of it.  Therefore, \""
           + 0x82;
      local_b0[0] = local_f8[8];
      local_b0[1] = local_f8[9];
      local_b0[2] = local_f8[10];
      local_b0[3] = local_f8[0xb];
      local_b0[4] = local_f8[0xc];
      local_b0[5] = local_f8[0xd];
      local_b0[6] = local_f8[0xe];
      local_b0[7] = local_f8[0xf];
      local_b0[8] = local_f8[0];
      local_b0[9] = local_f8[1];
      local_b0[10] = local_f8[2];
      local_b0[0xb] = local_f8[3];
      local_b0[0xc] = local_f8[4];
      local_b0[0xd] = local_f8[5];
      local_b0[0xe] = local_f8[6];
      local_b0[0xf] = local_f8[7];
      local_60.piece_._M_len = 1;
      local_60.piece_._M_str = "\"";
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_80,(lts_20250127 *)(local_148 + 0x18),(AlphaNum *)local_b0,&local_60,
                 (AlphaNum *)0x4161f1);
      std::__cxx11::string::operator=(local_f8,(string *)&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
    }
    local_148._24_8_ = local_d8;
    local_148._32_8_ = local_f8;
    local_120[0] = (EnumValueDescriptor *)(local_d8 + 0x10);
    pcStack_b8 = absl::lts_20250127::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::BuildEnumValue(google::protobuf::EnumValueDescriptorProto_const&,google::protobuf::EnumDescriptor_const*,google::protobuf::EnumValueDescriptor*,google::protobuf::internal::FlatAllocator&)::__0,std::__cxx11::string>
    ;
    local_d8._24_8_ = local_148 + 0x18;
    make_error.invoker_ =
         absl::lts_20250127::functional_internal::
         InvokeObject<google::protobuf::DescriptorBuilder::BuildEnumValue(google::protobuf::EnumValueDescriptorProto_const&,google::protobuf::EnumDescriptor_const*,google::protobuf::EnumValueDescriptor*,google::protobuf::internal::FlatAllocator&)::__0,std::__cxx11::string>
    ;
    make_error.ptr_.fun = (_func_void *)local_d8._24_8_;
    element_name._M_str = result->all_names_[1]._M_dataplus._M_p;
    element_name._M_len = result->all_names_[1]._M_string_length;
    AddError(this,element_name,(Message *)proto_00,NAME,make_error);
    result = (EnumValueDescriptor *)local_d8._0_8_;
    if ((FieldOptions_FeatureSupport *)local_f8._0_8_ != (FieldOptions_FeatureSupport *)local_e8) {
      operator_delete((void *)local_f8._0_8_,CONCAT71(local_e8._1_7_,local_e8[0]) + 1);
      result = (EnumValueDescriptor *)local_d8._0_8_;
    }
  }
  FileDescriptorTables::AddEnumValueByNumber(this->file_tables_,result);
  if (local_158 != (EnumValueOptions *)local_148) {
    operator_delete(local_158,CONCAT71(local_148._1_7_,local_148[0]) + 1);
  }
  return;
}

Assistant:

void DescriptorBuilder::BuildEnumValue(const EnumValueDescriptorProto& proto,
                                       const EnumDescriptor* parent,
                                       EnumValueDescriptor* result,
                                       internal::FlatAllocator& alloc) {
  // Note:  full_name for enum values is a sibling to the parent's name, not a
  //   child of it.
  std::string full_name;
  size_t scope_len = parent->full_name().size() - parent->name().size();
  full_name.reserve(scope_len + proto.name().size());
  full_name.append(parent->full_name().data(), scope_len);
  full_name.append(proto.name());

  result->all_names_ =
      alloc.AllocateStrings(proto.name(), std::move(full_name));
  result->number_ = proto.number();
  result->type_ = parent;

  ValidateSymbolName(proto.name(), result->full_name(), proto);

  // Copy options.
  AllocateOptions(proto, result, EnumValueDescriptorProto::kOptionsFieldNumber,
                  "google.protobuf.EnumValueOptions", alloc);

  // Again, enum values are weird because we makes them appear as siblings
  // of the enum type instead of children of it.  So, we use
  // parent->containing_type() as the value's parent.
  bool added_to_outer_scope =
      AddSymbol(result->full_name(), parent->containing_type(), result->name(),
                proto, Symbol::EnumValue(result, 0));

  // However, we also want to be able to search for values within a single
  // enum type, so we add it as a child of the enum type itself, too.
  // Note:  This could fail, but if it does, the error has already been
  //   reported by the above AddSymbol() call, so we ignore the return code.
  bool added_to_inner_scope = file_tables_->AddAliasUnderParent(
      parent, result->name(), Symbol::EnumValue(result, 1));

  if (added_to_inner_scope && !added_to_outer_scope) {
    // This value did not conflict with any values defined in the same enum,
    // but it did conflict with some other symbol defined in the enum type's
    // scope.  Let's print an additional error to explain this.
    std::string outer_scope;
    if (parent->containing_type() == nullptr) {
      outer_scope = std::string(file_->package());
    } else {
      outer_scope = std::string(parent->containing_type()->full_name());
    }

    if (outer_scope.empty()) {
      outer_scope = "the global scope";
    } else {
      outer_scope = absl::StrCat("\"", outer_scope, "\"");
    }

    AddError(
        result->full_name(), proto, DescriptorPool::ErrorCollector::NAME, [&] {
          return absl::StrCat(
              "Note that enum values use C++ scoping rules, meaning that "
              "enum values are siblings of their type, not children of it.  "
              "Therefore, \"",
              result->name(), "\" must be unique within ", outer_scope,
              ", not just within \"", parent->name(), "\".");
        });
  }

  // An enum is allowed to define two numbers that refer to the same value.
  // FindValueByNumber() should return the first such value, so we simply
  // ignore AddEnumValueByNumber()'s return code.
  file_tables_->AddEnumValueByNumber(result);
}